

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulesC.cpp
# Opt level: O1

char * SoapySDR_unloadModule(char *path)

{
  char *__dest;
  allocator local_51;
  string local_50;
  string local_30;
  
  SoapySDRDevice_clearError();
  std::__cxx11::string::string((string *)&local_30,path,&local_51);
  SoapySDR::unloadModule(&local_50,&local_30);
  __dest = callocArrayType<char>(local_50._M_string_length + 1);
  if (local_50._M_string_length != 0) {
    memmove(__dest,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __dest;
}

Assistant:

char *SoapySDR_unloadModule(const char *path)
{
    __SOAPY_SDR_C_TRY
    return toCString(SoapySDR::unloadModule(path));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}